

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

BrotliDecoderErrorCode
WriteRingBuffer(BrotliDecoderStateInternal *s,size_t *available_out,uint8_t **next_out,
               size_t *total_out,int force)

{
  int iVar1;
  ulong uVar2;
  BrotliDecoderErrorCode BVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong __n;
  size_t sVar7;
  
  iVar1 = s->ringbuffer_size;
  iVar5 = s->pos;
  if (iVar1 <= s->pos) {
    iVar5 = iVar1;
  }
  uVar6 = ((long)iVar5 - s->partial_pos_out) + (long)iVar1 * s->rb_roundtrips;
  uVar2 = *available_out;
  __n = uVar6;
  if (uVar2 < uVar6) {
    __n = uVar2;
  }
  if (s->meta_block_remaining_len < 0) {
    BVar3 = BROTLI_DECODER_ERROR_FORMAT_BLOCK_LENGTH_1;
  }
  else {
    uVar4 = uVar2;
    if (next_out != (uint8_t **)0x0) {
      if (*next_out == (uint8_t *)0x0) {
        *next_out = s->ringbuffer + (s->partial_pos_out & (long)s->ringbuffer_mask);
      }
      else {
        memcpy(*next_out,s->ringbuffer + (s->partial_pos_out & (long)s->ringbuffer_mask),__n);
        *next_out = *next_out + __n;
        uVar4 = *available_out;
      }
    }
    *available_out = uVar4 - __n;
    sVar7 = __n + s->partial_pos_out;
    s->partial_pos_out = sVar7;
    if (total_out != (size_t *)0x0) {
      *total_out = sVar7;
    }
    iVar5 = 1 << ((byte)s->window_bits & 0x1f);
    BVar3 = BROTLI_DECODER_SUCCESS;
    iVar1 = s->ringbuffer_size;
    if (uVar2 < uVar6) {
      BVar3 = BROTLI_DECODER_NEEDS_MORE_OUTPUT;
      if (force == 0) {
        BVar3 = (iVar1 == iVar5) + 1 + (uint)(iVar1 == iVar5);
      }
    }
    else if (iVar1 == iVar5) {
      iVar5 = s->pos - iVar1;
      if (iVar1 <= s->pos) {
        s->pos = iVar5;
        s->rb_roundtrips = s->rb_roundtrips + 1;
        *(ushort *)&s->field_0x338 =
             ((ushort)*(undefined4 *)&s->field_0x338 & 0xfff7) + (ushort)(iVar5 != 0) * 8;
      }
    }
  }
  return BVar3;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE WriteRingBuffer(
    BrotliDecoderState* s, size_t* available_out, uint8_t** next_out,
    size_t* total_out, BROTLI_BOOL force) {
  uint8_t* start =
      s->ringbuffer + (s->partial_pos_out & (size_t)s->ringbuffer_mask);
  size_t to_write = UnwrittenBytes(s, BROTLI_TRUE);
  size_t num_written = *available_out;
  if (num_written > to_write) {
    num_written = to_write;
  }
  if (s->meta_block_remaining_len < 0) {
    return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_BLOCK_LENGTH_1);
  }
  if (next_out && !*next_out) {
    *next_out = start;
  } else {
    if (next_out) {
      memcpy(*next_out, start, num_written);
      *next_out += num_written;
    }
  }
  *available_out -= num_written;
  BROTLI_LOG_UINT(to_write);
  BROTLI_LOG_UINT(num_written);
  s->partial_pos_out += num_written;
  if (total_out) {
    *total_out = s->partial_pos_out;
  }
  if (num_written < to_write) {
    if (s->ringbuffer_size == (1 << s->window_bits) || force) {
      return BROTLI_DECODER_NEEDS_MORE_OUTPUT;
    } else {
      return BROTLI_DECODER_SUCCESS;
    }
  }
  /* Wrap ring buffer only if it has reached its maximal size. */
  if (s->ringbuffer_size == (1 << s->window_bits) &&
      s->pos >= s->ringbuffer_size) {
    s->pos -= s->ringbuffer_size;
    s->rb_roundtrips++;
    s->should_wrap_ringbuffer = (size_t)s->pos != 0 ? 1 : 0;
  }
  return BROTLI_DECODER_SUCCESS;
}